

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqapi.cpp
# Opt level: O0

SQRESULT sq_reservestack(HSQUIRRELVM v,SQInteger nsize)

{
  SQUnsignedInteger SVar1;
  SQRESULT SVar2;
  long lVar3;
  SQUnsignedInteger SVar4;
  sqvector<SQObjectPtr> *this;
  SQObjectPtr local_30;
  SQInteger local_20;
  SQInteger nsize_local;
  HSQUIRRELVM v_local;
  
  lVar3 = v->_top;
  local_20 = nsize;
  nsize_local = (SQInteger)v;
  SVar1 = sqvector<SQObjectPtr>::size(&v->_stack);
  if (SVar1 < (ulong)(lVar3 + nsize)) {
    if (*(long *)(nsize_local + 0x128) != 0) {
      SVar2 = sq_throwerror((HSQUIRRELVM)nsize_local,"cannot resize stack while in a metamethod");
      return SVar2;
    }
    this = (sqvector<SQObjectPtr> *)(nsize_local + 0x30);
    SVar1 = sqvector<SQObjectPtr>::size(this);
    lVar3 = *(long *)(nsize_local + 0x48) + local_20;
    SVar4 = sqvector<SQObjectPtr>::size((sqvector<SQObjectPtr> *)(nsize_local + 0x30));
    SQObjectPtr::SQObjectPtr(&local_30);
    sqvector<SQObjectPtr>::resize(this,SVar1 + (lVar3 - SVar4),&local_30);
    SQObjectPtr::~SQObjectPtr(&local_30);
  }
  return 0;
}

Assistant:

SQRESULT sq_reservestack(HSQUIRRELVM v,SQInteger nsize)
{
    if (((SQUnsignedInteger)v->_top + nsize) > v->_stack.size()) {
        if(v->_nmetamethodscall) {
            return sq_throwerror(v,_SC("cannot resize stack while in a metamethod"));
        }
        v->_stack.resize(v->_stack.size() + ((v->_top + nsize) - v->_stack.size()));
    }
    return SQ_OK;
}